

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

void tif_32sto5u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  OPJ_INT32 OVar1;
  uint uVar2;
  uint uVar3;
  OPJ_INT32 OVar4;
  int iVar5;
  ulong uVar6;
  sbyte sVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  
  uVar6 = 0;
  if ((length & 0xfffffffffffffff8) != 0) {
    do {
      uVar10 = pSrc[uVar6 + 1];
      OVar1 = pSrc[uVar6 + 2];
      uVar8 = pSrc[uVar6 + 3];
      uVar2 = pSrc[uVar6 + 4];
      uVar3 = pSrc[uVar6 + 6];
      OVar4 = pSrc[uVar6 + 7];
      iVar5 = pSrc[uVar6 + 5];
      *pDst = (byte)(uVar10 >> 2) | (byte)(pSrc[uVar6] << 3);
      pDst[1] = (byte)(uVar8 >> 4) | (char)OVar1 * '\x02' | (byte)(uVar10 << 6);
      pDst[2] = (byte)(uVar2 >> 1) | (byte)(uVar8 << 4);
      pDst[3] = (byte)(uVar3 >> 3) | (byte)(iVar5 << 2) | (byte)(uVar2 << 7);
      pDst[4] = (byte)(uVar3 << 5) | (byte)OVar4;
      pDst = pDst + 5;
      uVar6 = uVar6 + 8;
    } while (uVar6 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    uVar10 = pSrc[uVar6];
    sVar7 = 3;
    uVar8 = (uint)(length & 7);
    pbVar9 = pDst;
    if (uVar8 != 1) {
      pbVar9 = pDst + 1;
      *pDst = (byte)((uint)pSrc[uVar6 + 1] >> 2) | (byte)(uVar10 << 3);
      uVar10 = pSrc[uVar6 + 1] & 3;
      sVar7 = 6;
      if (2 < uVar8) {
        uVar10 = uVar10 << 5 | pSrc[uVar6 + 2];
        sVar7 = 1;
        if (uVar8 != 3) {
          pDst[1] = (byte)((uint)pSrc[uVar6 + 3] >> 4) | (char)uVar10 * '\x02';
          uVar10 = pSrc[uVar6 + 3] & 0xf;
          if (uVar8 < 5) {
            pbVar9 = pDst + 2;
            sVar7 = 4;
          }
          else {
            pbVar9 = pDst + 3;
            pDst[2] = (byte)((uint)pSrc[uVar6 + 4] >> 1) | (byte)(uVar10 << 4);
            uVar10 = pSrc[uVar6 + 4] & 1;
            sVar7 = 7;
            if (uVar8 != 5) {
              uVar10 = uVar10 << 5 | pSrc[uVar6 + 5];
              sVar7 = 2;
              if (uVar8 == 7) {
                pDst[3] = (byte)((uint)pSrc[uVar6 + 6] >> 3) | (byte)(uVar10 << 2);
                uVar10 = pSrc[uVar6 + 6] & 7;
                pbVar9 = pDst + 4;
                sVar7 = 5;
              }
            }
          }
        }
      }
    }
    *pbVar9 = (byte)(uVar10 << sVar7);
  }
  return;
}

Assistant:

static void tif_32sto5u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i+4];
		OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i+5];
		OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i+6];
		OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i+7];
		
		*pDst++ = (OPJ_BYTE)((src0 << 3) | (src1 >> 2));
		*pDst++ = (OPJ_BYTE)((src1 << 6) | (src2 << 1) | (src3 >> 4));
		*pDst++ = (OPJ_BYTE)((src3 << 4) | (src4 >> 1));
		*pDst++ = (OPJ_BYTE)((src4 << 7) | (src5 << 2) | (src6 >> 3));
		*pDst++ = (OPJ_BYTE)((src6 << 5) | (src7));

	}
	
	if (length & 7U) {
		unsigned int trailing = 0U;
		int remaining = 8U;
		length &= 7U;
		PUTBITS((OPJ_UINT32)pSrc[i+0], 5)
		if (length > 1U) {
			PUTBITS((OPJ_UINT32)pSrc[i+1], 5)
			if (length > 2U) {
				PUTBITS((OPJ_UINT32)pSrc[i+2], 5)
				if (length > 3U) {
					PUTBITS((OPJ_UINT32)pSrc[i+3], 5)
					if (length > 4U) {
						PUTBITS((OPJ_UINT32)pSrc[i+4], 5)
						if (length > 5U) {
							PUTBITS((OPJ_UINT32)pSrc[i+5], 5)
							if (length > 6U) {
								PUTBITS((OPJ_UINT32)pSrc[i+6], 5)
							}
						}
					}
				}
			}
		}
		FLUSHBITS()
	}
}